

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

bool __thiscall
QFutureInterfaceBasePrivate::internal_updateProgress
          (QFutureInterfaceBasePrivate *this,int progress,QString *progressText)

{
  bool bVar1;
  ProgressData *pPVar2;
  qint64 qVar3;
  QString *in_RDX;
  int in_ESI;
  QElapsedTimer *in_RDI;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar4;
  bool local_1;
  
  if (*(int *)((long)&in_RDI[0xc].t1 + 4) < in_ESI) {
    *(int *)((long)&in_RDI[0xc].t1 + 4) = in_ESI;
    QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
    ::operator->((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                  *)&in_RDI[0xc].t2);
    QString::operator=(in_RDX,(QString *)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    bVar1 = QElapsedTimer::isValid((QElapsedTimer *)&in_RDI[2].t2);
    if (bVar1) {
      iVar4 = *(int *)((long)&in_RDI[0xc].t1 + 4);
      pPVar2 = QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
               ::operator->((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                             *)&in_RDI[0xc].t2);
      if ((iVar4 != pPVar2->maximum) && (qVar3 = QElapsedTimer::elapsed(in_RDI), qVar3 < 0x28)) {
        return false;
      }
    }
    QElapsedTimer::start(in_RDI);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QFutureInterfaceBasePrivate::internal_updateProgress(int progress,
                                                          const QString &progressText)
{
    if (m_progressValue >= progress)
        return false;

    Q_ASSERT(m_progress);

    m_progressValue = progress;
    m_progress->text = progressText;

    if (progressTime.isValid() && m_progressValue != m_progress->maximum) // make sure the first and last steps are emitted.
        if (progressTime.elapsed() < (1000 / MaxProgressEmitsPerSecond))
            return false;

    progressTime.start();
    return true;
}